

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

bool __thiscall Js::PathTypeHandlerBase::HasAnyFixedProperties(PathTypeHandlerBase *this)

{
  bool bVar1;
  uint16 uVar2;
  TypePath *this_00;
  ushort local_1e;
  PropertyIndex i;
  int pathLength;
  PathTypeHandlerBase *this_local;
  
  uVar2 = GetPathLength(this);
  local_1e = 0;
  while( true ) {
    if ((uint)uVar2 <= (uint)local_1e) {
      return false;
    }
    this_00 = GetTypePath(this);
    bVar1 = TypePath::GetIsFixedFieldAt(this_00,local_1e,(uint)uVar2);
    if (bVar1) break;
    local_1e = local_1e + 1;
  }
  return true;
}

Assistant:

bool PathTypeHandlerBase::HasAnyFixedProperties() const
    {
        int pathLength = GetPathLength();
        for (PropertyIndex i = 0; i < pathLength; i++)
        {
            if (this->GetTypePath()->GetIsFixedFieldAt(i, pathLength))
            {
                return true;
            }
        }
        return false;
    }